

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall spvtools::val::ValidationState_t::IsPointerType(ValidationState_t *this,uint32_t id)

{
  Op OVar1;
  Instruction *this_00;
  bool local_31;
  Instruction *inst;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  if (id == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = FindDef(this,id);
    if (this_00 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x4b7,"bool spvtools::val::ValidationState_t::IsPointerType(uint32_t) const");
    }
    OVar1 = val::Instruction::opcode(this_00);
    local_31 = true;
    if (OVar1 != OpTypePointer) {
      OVar1 = val::Instruction::opcode(this_00);
      local_31 = OVar1 == OpTypeUntypedPointerKHR;
    }
    this_local._7_1_ = local_31;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::IsPointerType(uint32_t id) const {
  if (!id) return false;
  const Instruction* inst = FindDef(id);
  assert(inst);
  return inst->opcode() == spv::Op::OpTypePointer ||
         inst->opcode() == spv::Op::OpTypeUntypedPointerKHR;
}